

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

int __thiscall yyFlexLexer::LexerInput(yyFlexLexer *this,char *buf,int max_size)

{
  int iVar1;
  ulong uVar2;
  int max_size_local;
  char *buf_local;
  yyFlexLexer *this_local;
  
  uVar2 = std::ios::eof();
  if (((uVar2 & 1) == 0) && (uVar2 = std::ios::fail(), (uVar2 & 1) == 0)) {
    std::istream::read((char *)&this->yyin,(long)buf);
    uVar2 = std::ios::bad();
    if ((uVar2 & 1) == 0) {
      iVar1 = std::istream::gcount();
      return iVar1;
    }
    return -1;
  }
  return 0;
}

Assistant:

int yyFlexLexer::LexerInput( char* buf, int max_size )
#endif
{
	if ( yyin.eof() || yyin.fail() )
		return 0;

#ifdef YY_INTERACTIVE
	yyin.get( buf[0] );

	if ( yyin.eof() )
		return 0;

	if ( yyin.bad() )
		return -1;

	return 1;

#else
	(void) yyin.read( buf, max_size );

	if ( yyin.bad() )
		return -1;
	else
		return yyin.gcount();
#endif
}